

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O1

local_m_extrapolation_t * __thiscall
tchecker::zg::details::local_m_extrapolation_t::operator=
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  if (this != e) {
    this->_m = e->_m;
    e->_m = (map_t *)0x0;
    peVar1 = (e->_clock_bounds).
             super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var2 = (e->_clock_bounds).
             super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (e->_clock_bounds).
    super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (e->_clock_bounds).
    super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->_clock_bounds).
              super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->_clock_bounds).
    super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->_clock_bounds).
    super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return this;
}

Assistant:

tchecker::zg::details::local_m_extrapolation_t &
local_m_extrapolation_t::operator=(tchecker::zg::details::local_m_extrapolation_t && e)
{
  if (this != &e) {
    _m = std::move(e._m);
    e._m = nullptr;
    _clock_bounds = std::move(e._clock_bounds);
  }
  return *this;
}